

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  Curl_addrinfo *cahead;
  size_t entry_len_1;
  char *entry_id_1;
  Curl_addrinfo *addr;
  Curl_dns_entry *dns;
  size_t entry_len;
  char *entry_id;
  char local_228 [4];
  int port;
  char address [256];
  char hostname [256];
  curl_slist *local_20;
  curl_slist *hostp;
  Curl_easy *data_local;
  
  local_20 = (data->change).resolve;
  do {
    if (local_20 == (curl_slist *)0x0) {
      (data->change).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    if (local_20->data != (char *)0x0) {
      if (*local_20->data == '-') {
        iVar1 = __isoc99_sscanf(local_20->data + 1,"%255[^:]:%d",address + 0xf8,(long)&entry_id + 4)
        ;
        if (iVar1 == 2) {
          pcVar2 = create_hostcache_id(address + 0xf8,entry_id._4_4_);
          if (pcVar2 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          sVar3 = strlen(pcVar2);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          Curl_hash_delete((data->dns).hostcache,pcVar2,sVar3 + 1);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          (*Curl_cfree)(pcVar2);
        }
        else {
          Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'!\n",local_20->data);
        }
      }
      else {
        iVar1 = __isoc99_sscanf(local_20->data,"%255[^:]:%d:%255s",address + 0xf8,
                                (long)&entry_id + 4,local_228);
        if (iVar1 == 3) {
          cahead = Curl_str2addr(local_228,entry_id._4_4_);
          if (cahead == (Curl_addrinfo *)0x0) {
            Curl_infof(data,"Address in \'%s\' found illegal!\n",local_20->data);
          }
          else {
            pcVar2 = create_hostcache_id(address + 0xf8,entry_id._4_4_);
            if (pcVar2 == (char *)0x0) {
              Curl_freeaddrinfo(cahead);
              return CURLE_OUT_OF_MEMORY;
            }
            sVar3 = strlen(pcVar2);
            if (data->share != (Curl_share *)0x0) {
              Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
            }
            addr = (Curl_addrinfo *)Curl_hash_pick((data->dns).hostcache,pcVar2,sVar3 + 1);
            (*Curl_cfree)(pcVar2);
            if (addr == (Curl_addrinfo *)0x0) {
              addr = (Curl_addrinfo *)Curl_cache_addr(data,cahead,address + 0xf8,entry_id._4_4_);
              if (addr != (Curl_addrinfo *)0x0) {
                *(time_t *)&addr->ai_socktype = 0;
                *(long *)&addr->ai_addrlen = *(long *)&addr->ai_addrlen + -1;
              }
            }
            else {
              Curl_freeaddrinfo(cahead);
            }
            if (data->share != (Curl_share *)0x0) {
              Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
            }
            if (addr == (Curl_addrinfo *)0x0) {
              Curl_freeaddrinfo(cahead);
              return CURLE_OUT_OF_MEMORY;
            }
            Curl_infof(data,"Added %s:%d:%s to DNS cache\n",address + 0xf8,(ulong)entry_id._4_4_,
                       local_228);
          }
        }
        else {
          Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'!\n",local_20->data);
        }
      }
    }
    local_20 = local_20->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  char address[256];
  int port;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next) {
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      char *entry_id;
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'!\n",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len+1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      /* free the allocated entry_id again */
      free(entry_id);
    }
    else {
      struct Curl_dns_entry *dns;
      Curl_addrinfo *addr;
      char *entry_id;
      size_t entry_len;

      if(3 != sscanf(hostp->data, "%255[^:]:%d:%255s", hostname, &port,
                     address)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'!\n",
              hostp->data);
        continue;
      }

      addr = Curl_str2addr(address, port);
      if(!addr) {
        infof(data, "Address in '%s' found illegal!\n", hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        Curl_freeaddrinfo(addr);
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len+1);

      /* free the allocated entry_id again */
      free(entry_id);

      if(!dns) {
        /* if not in the cache already, put this host in the cache */
        dns = Curl_cache_addr(data, addr, hostname, port);
        if(dns) {
          dns->timestamp = 0; /* mark as added by CURLOPT_RESOLVE */
          /* release the returned reference; the cache itself will keep the
           * entry alive: */
          dns->inuse--;
        }
      }
      else
        /* this is a duplicate, free it again */
        Curl_freeaddrinfo(addr);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(addr);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, address);
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}